

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_footprints.cpp
# Opt level: O3

void __thiscall cp::PlanFootprints::calcNextFootprint(PlanFootprints *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  ulong uVar15;
  long lVar16;
  undefined1 auVar17 [16];
  double dVar18;
  double dVar19;
  undefined1 auVar20 [16];
  
  uVar15 = (ulong)*(uint *)(this + 0x2e0);
  dVar1 = *(double *)(this + 0x1f0);
  dVar2 = *(double *)(this + 0x208);
  dVar8 = *(double *)(this + 0x1f8);
  dVar9 = *(double *)(this + 0x200);
  dVar3 = *(double *)(this + uVar15 * 0x18 + 0x4e0);
  dVar10 = *(double *)(this + uVar15 * 0x18 + 0x4e0 + 8);
  dVar5 = dVar10 * dVar8 - dVar3 * dVar9;
  dVar6 = *(double *)(this + uVar15 * 0x18 + 0x4d8) * dVar9 - dVar10 * dVar1;
  dVar18 = dVar1 * dVar3 - *(double *)(this + uVar15 * 0x18 + 0x4d8) * dVar8;
  dVar5 = dVar5 + dVar5;
  dVar6 = dVar6 + dVar6;
  dVar18 = dVar18 + dVar18;
  dVar7 = dVar6 * dVar2 + *(double *)(this + uVar15 * 0x18 + 0x4d8 + 8) +
          (dVar5 * dVar9 - dVar18 * dVar1) + *(double *)(this + 0x1d8);
  dVar3 = *(double *)(this + 0x1e0);
  dVar11 = *(double *)(this + 0x330);
  dVar12 = *(double *)(this + 0x338);
  dVar13 = *(double *)(this + 0x340);
  dVar14 = *(double *)(this + 0x348);
  dVar19 = dVar9 * dVar11 - dVar1 * dVar13;
  auVar20._8_4_ = SUB84(dVar19,0);
  auVar20._0_8_ = dVar9 * dVar12 - dVar1 * dVar14;
  auVar20._12_4_ = (int)((ulong)dVar19 >> 0x20);
  auVar20 = auVar20 ^ _DAT_0010a040;
  dVar19 = dVar1 * dVar11 + dVar9 * dVar13;
  auVar17._8_4_ = SUB84(dVar19,0);
  auVar17._0_8_ = dVar1 * dVar12 + dVar9 * dVar14;
  auVar17._12_4_ = (int)((ulong)dVar19 >> 0x20);
  auVar17 = auVar17 ^ _DAT_0010a050;
  lVar16 = uVar15 * 0xe0;
  auVar4._8_4_ = SUB84(dVar7,0);
  auVar4._0_8_ = dVar5 * dVar2 + *(double *)(this + uVar15 * 0x18 + 0x4d8) +
                 (dVar18 * dVar8 - dVar6 * dVar9) + *(double *)(this + 0x1d0);
  auVar4._12_4_ = (int)((ulong)dVar7 >> 0x20);
  *(undefined1 (*) [16])(this + lVar16 + 0x10) = auVar4;
  *(double *)(this + lVar16 + 0x20) =
       dVar18 * dVar2 + dVar10 + (dVar6 * dVar1 - dVar5 * dVar8) + dVar3;
  *(double *)(this + lVar16 + 0x30) = auVar20._0_8_ + dVar8 * dVar13 + dVar2 * dVar11;
  *(double *)(this + lVar16 + 0x30 + 8) = auVar20._8_8_ + dVar8 * dVar14 + dVar2 * dVar12;
  *(double *)(this + lVar16 + 0x40) = auVar17._0_8_ + (dVar2 * dVar13 - dVar8 * dVar11);
  *(double *)(this + lVar16 + 0x40 + 8) = auVar17._8_8_ + (dVar2 * dVar14 - dVar8 * dVar12);
  *(undefined8 *)(this + 0x2b0) = *(undefined8 *)(this + 0x1f0);
  *(undefined8 *)(this + 0x2b8) = *(undefined8 *)(this + 0x1f8);
  *(undefined8 *)(this + 0x2c0) = *(undefined8 *)(this + 0x200);
  *(undefined8 *)(this + 0x2c8) = *(undefined8 *)(this + 0x208);
  return;
}

Assistant:

void PlanFootprints::calcNextFootprint() {
  Vector3 ref_land_pose_p = ref_waist_pose.p() +
                            ref_waist_pose.q() * dist_body2foot[swingleg];
  Quat ref_land_pose_q    = ref_waist_pose.q() * init_feet_pose[0].q();
  ref_land_pose[swingleg].set(ref_land_pose_p, ref_land_pose_q);
  ref_waist_r = ref_waist_pose.q();
}